

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

int __thiscall
absl::synchronization_internal::GraphCycles::FindPath
          (GraphCycles *this,GraphId idx,GraphId idy,int max_path_len,GraphId *path)

{
  int *piVar1;
  Vec<int> *this_00;
  uint uVar2;
  Rep *pRVar3;
  Node **ppNVar4;
  Node *pNVar5;
  int *v;
  int iVar6;
  bool bVar7;
  uint32_t uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int32_t _cursor;
  uint uVar13;
  ulong uVar14;
  int32_t w;
  int32_t x;
  NodeSet seen;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  GraphCycles *local_80;
  GraphId *local_78;
  uint64_t local_70;
  NodeSet local_68;
  ulong uVar15;
  
  pRVar3 = this->rep_;
  ppNVar4 = (pRVar3->nodes_).ptr_;
  local_84 = (int)idx.handle;
  pNVar5 = ppNVar4[idx.handle & 0xffffffff];
  iVar10 = 0;
  iVar12 = 0;
  if ((((pNVar5 != (Node *)0x0) &&
       (iVar12 = iVar10, pNVar5->version == (uint32_t)(idx.handle >> 0x20))) &&
      (pNVar5 = ppNVar4[idy.handle & 0xffffffff], pNVar5 != (Node *)0x0)) &&
     (pNVar5->version == (uint32_t)(idy.handle >> 0x20))) {
    local_88 = max_path_len;
    local_80 = this;
    local_78 = path;
    anon_unknown_0::NodeSet::NodeSet(&local_68);
    v = (pRVar3->stack_).ptr_;
    piVar1 = (pRVar3->stack_).space_;
    if (v != piVar1) {
      base_internal::LowLevelAlloc::Free(v);
    }
    this_00 = &pRVar3->stack_;
    (pRVar3->stack_).ptr_ = piVar1;
    (pRVar3->stack_).size_ = 0;
    (pRVar3->stack_).capacity_ = 8;
    anon_unknown_0::Vec<int>::push_back(this_00,&local_84);
    uVar8 = (pRVar3->stack_).size_;
    if (uVar8 != 0) {
      local_94 = 0;
      local_70 = idy.handle;
      do {
        iVar12 = (pRVar3->stack_).ptr_[uVar8 - 1];
        uVar11 = (ulong)iVar12;
        (pRVar3->stack_).size_ = uVar8 - 1;
        if ((long)uVar11 < 0) {
          local_94 = local_94 + -1;
          bVar7 = false;
          iVar10 = local_8c;
        }
        else {
          if (local_94 < local_88) {
            local_78[local_94].handle =
                 (ulong)(local_80->rep_->nodes_).ptr_[uVar11]->version << 0x20 | uVar11;
          }
          local_90 = -1;
          anon_unknown_0::Vec<int>::push_back(this_00,&local_90);
          local_94 = local_94 + 1;
          bVar7 = true;
          iVar10 = local_94;
          if (iVar12 != (int)local_70) {
            uVar14 = 0;
            iVar12 = local_90;
LAB_0014d572:
            pNVar5 = (pRVar3->nodes_).ptr_[uVar11];
            uVar2 = (pNVar5->out).table_.size_;
            uVar9 = (ulong)uVar2;
            uVar15 = uVar14;
            if (uVar2 < (uint)uVar14) {
              uVar9 = uVar14;
            }
            do {
              uVar13 = (uint)uVar15;
              uVar14 = uVar9;
              iVar10 = iVar12;
              iVar6 = local_90;
              if ((uint)uVar9 == uVar13) break;
              iVar10 = (pNVar5->out).table_.ptr_[uVar15];
              uVar14 = (ulong)(uVar13 + 1);
              uVar15 = uVar14;
              iVar6 = iVar10;
            } while (iVar10 < 0);
            local_90 = iVar6;
            iVar12 = iVar10;
            if (uVar13 < uVar2) {
              bVar7 = anon_unknown_0::NodeSet::insert(&local_68,iVar12);
              if (bVar7) {
                anon_unknown_0::Vec<int>::push_back(this_00,&local_90);
              }
              goto LAB_0014d572;
            }
            bVar7 = false;
            iVar10 = local_8c;
          }
        }
        local_8c = iVar10;
        iVar12 = local_8c;
        if (bVar7) goto LAB_0014d5f5;
        uVar8 = (pRVar3->stack_).size_;
      } while (uVar8 != 0);
    }
    iVar12 = 0;
LAB_0014d5f5:
    anon_unknown_0::Vec<int>::~Vec(&local_68.table_);
  }
  return iVar12;
}

Assistant:

int GraphCycles::FindPath(GraphId idx, GraphId idy, int max_path_len,
                          GraphId path[]) const {
  Rep* r = rep_;
  if (FindNode(r, idx) == nullptr || FindNode(r, idy) == nullptr) return 0;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);

  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = MakeId(n, rep_->nodes_[n]->version);
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    HASH_FOR_EACH(w, r->nodes_[n]->out) {
      if (seen.insert(w)) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}